

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevc_intra_pred_filters_sse42_intr.c
# Opt level: O1

void ihevc_intra_pred_ref_filtering_sse42
               (UWORD8 *pu1_src,WORD32 nt,UWORD8 *pu1_dst,WORD32 mode,
               WORD32 strong_intra_smoothing_enable_flag)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined8 uVar38;
  undefined8 uVar39;
  undefined8 uVar40;
  undefined8 uVar41;
  undefined8 uVar42;
  undefined8 uVar43;
  undefined8 uVar44;
  undefined8 uVar45;
  int iVar46;
  long lVar47;
  ulong uVar48;
  ulong uVar49;
  ulong uVar50;
  bool bVar51;
  uint uVar52;
  uint uVar53;
  int iVar54;
  byte *pbVar55;
  ulong uVar56;
  uint uVar57;
  int iVar58;
  int iVar59;
  uint uVar60;
  undefined1 in_XMM0 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  ushort uVar63;
  ushort uVar65;
  ushort uVar66;
  ushort uVar67;
  ushort uVar68;
  ushort uVar69;
  ushort uVar70;
  undefined1 in_XMM1 [16];
  undefined1 auVar64 [16];
  ushort uVar71;
  ushort uVar72;
  ushort uVar74;
  ushort uVar75;
  ushort uVar76;
  ushort uVar77;
  ushort uVar78;
  ushort uVar79;
  undefined1 in_XMM2 [16];
  undefined1 auVar73 [16];
  ushort uVar80;
  undefined1 in_XMM3 [16];
  undefined1 auVar81 [16];
  undefined1 in_XMM4 [16];
  undefined1 auVar82 [16];
  undefined1 in_XMM5 [16];
  undefined1 in_XMM6 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar83 [16];
  undefined1 in_XMM8 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  long lVar89;
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 in_XMM14 [16];
  undefined1 auVar103 [16];
  UWORD8 au1_flt [257];
  byte local_138;
  undefined1 auStack_137 [2];
  char acStack_135 [5];
  undefined8 uStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  undefined8 uStack_110;
  undefined8 local_108;
  undefined8 uStack_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  
  lVar47 = (long)nt;
  uVar56 = lVar47 * 4;
  iVar4 = 0;
  if (nt != 0) {
    for (; ((uint)nt >> iVar4 & 1) == 0; iVar4 = iVar4 + 1) {
    }
  }
  uVar57 = 1 << ((char)iVar4 - 2U & 0x1f);
  if (nt == 0) {
    uVar57 = 0;
  }
  if ((uVar57 & "\x0e"[mode]) == 0) {
    if (pu1_src == pu1_dst) {
      return;
    }
    switch(nt << 0x1e | nt - 4U >> 2) {
    case 0:
      uVar31 = *(undefined8 *)(pu1_src + 8);
      *(undefined8 *)pu1_dst = *(undefined8 *)pu1_src;
      *(undefined8 *)(pu1_dst + 8) = uVar31;
      break;
    case 1:
      uVar31 = *(undefined8 *)(pu1_src + 8);
      uVar32 = *(undefined8 *)(pu1_src + 0x10);
      uVar33 = *(undefined8 *)(pu1_src + 0x18);
      *(undefined8 *)pu1_dst = *(undefined8 *)pu1_src;
      *(undefined8 *)(pu1_dst + 8) = uVar31;
      *(undefined8 *)(pu1_dst + 0x10) = uVar32;
      *(undefined8 *)(pu1_dst + 0x18) = uVar33;
      break;
    default:
      goto switchD_0014e8c3_caseD_2;
    case 3:
      uVar31 = *(undefined8 *)(pu1_src + 8);
      uVar32 = *(undefined8 *)(pu1_src + 0x10);
      uVar33 = *(undefined8 *)(pu1_src + 0x18);
      uVar34 = *(undefined8 *)(pu1_src + 0x20);
      uVar35 = *(undefined8 *)(pu1_src + 0x28);
      uVar36 = *(undefined8 *)(pu1_src + 0x30);
      uVar37 = *(undefined8 *)(pu1_src + 0x38);
      *(undefined8 *)pu1_dst = *(undefined8 *)pu1_src;
      *(undefined8 *)(pu1_dst + 8) = uVar31;
      *(undefined8 *)(pu1_dst + 0x10) = uVar32;
      *(undefined8 *)(pu1_dst + 0x18) = uVar33;
      *(undefined8 *)(pu1_dst + 0x20) = uVar34;
      *(undefined8 *)(pu1_dst + 0x28) = uVar35;
      *(undefined8 *)(pu1_dst + 0x30) = uVar36;
      *(undefined8 *)(pu1_dst + 0x38) = uVar37;
      break;
    case 7:
      uVar31 = *(undefined8 *)(pu1_src + 8);
      uVar32 = *(undefined8 *)(pu1_src + 0x10);
      uVar33 = *(undefined8 *)(pu1_src + 0x18);
      uVar34 = *(undefined8 *)(pu1_src + 0x20);
      uVar35 = *(undefined8 *)(pu1_src + 0x28);
      uVar36 = *(undefined8 *)(pu1_src + 0x30);
      uVar37 = *(undefined8 *)(pu1_src + 0x38);
      uVar38 = *(undefined8 *)(pu1_src + 0x40);
      uVar39 = *(undefined8 *)(pu1_src + 0x48);
      uVar40 = *(undefined8 *)(pu1_src + 0x50);
      uVar41 = *(undefined8 *)(pu1_src + 0x58);
      uVar42 = *(undefined8 *)(pu1_src + 0x60);
      uVar43 = *(undefined8 *)(pu1_src + 0x68);
      uVar44 = *(undefined8 *)(pu1_src + 0x70);
      uVar45 = *(undefined8 *)(pu1_src + 0x78);
      *(undefined8 *)pu1_dst = *(undefined8 *)pu1_src;
      *(undefined8 *)(pu1_dst + 8) = uVar31;
      *(undefined8 *)(pu1_dst + 0x10) = uVar32;
      *(undefined8 *)(pu1_dst + 0x18) = uVar33;
      *(undefined8 *)(pu1_dst + 0x20) = uVar34;
      *(undefined8 *)(pu1_dst + 0x28) = uVar35;
      *(undefined8 *)(pu1_dst + 0x30) = uVar36;
      *(undefined8 *)(pu1_dst + 0x38) = uVar37;
      *(undefined8 *)(pu1_dst + 0x40) = uVar38;
      *(undefined8 *)(pu1_dst + 0x48) = uVar39;
      *(undefined8 *)(pu1_dst + 0x50) = uVar40;
      *(undefined8 *)(pu1_dst + 0x58) = uVar41;
      *(undefined8 *)(pu1_dst + 0x60) = uVar42;
      *(undefined8 *)(pu1_dst + 0x68) = uVar43;
      *(undefined8 *)(pu1_dst + 0x70) = uVar44;
      *(undefined8 *)(pu1_dst + 0x78) = uVar45;
    }
    uVar56 = uVar56 & 0xffffffff;
    pbVar55 = pu1_src + uVar56;
  }
  else {
    bVar51 = true;
    if (nt == 0x20 && strong_intra_smoothing_enable_flag == 1) {
      uVar52 = (uint)pu1_src[uVar56 & 0xffffffff] + (uint)pu1_src[0x40] + (uint)pu1_src[0x60] * -2;
      uVar57 = -uVar52;
      if (0 < (int)uVar52) {
        uVar57 = uVar52;
      }
      uVar53 = (uint)*pu1_src + (uint)pu1_src[0x40] + (uint)pu1_src[0x20] * -2;
      uVar52 = -uVar53;
      if (0 < (int)uVar53) {
        uVar52 = uVar53;
      }
      bVar51 = 7 < uVar52 || 7 < uVar57;
    }
    bVar1 = *pu1_src;
    bVar2 = pu1_src[uVar56];
    pbVar55 = auStack_137 + (uVar56 - 1);
    local_138 = bVar1;
    *pbVar55 = bVar2;
    if (bVar51) {
      local_138 = bVar1;
      *pbVar55 = bVar2;
      if (0 < nt) {
        uVar49 = 0;
        auVar61 = pmovsxbw(in_XMM0,0x202020202020202);
        do {
          auVar73 = *(undefined1 (*) [16])(pu1_src + uVar49);
          auVar81 = *(undefined1 (*) [16])(pu1_src + uVar49 + 8);
          auVar82 = pmovzxbw(in_XMM4,auVar73);
          auVar64 = pmovzxbw(auVar73 >> 8,auVar73 >> 8);
          auVar73 = pmovzxbw(auVar73 >> 0x10,auVar73 >> 0x10);
          uVar63 = (ushort)(auVar64._0_2_ * 2 + auVar73._0_2_ + auVar82._0_2_ + auVar61._0_2_) >> 2;
          uVar65 = (ushort)(auVar64._2_2_ * 2 + auVar73._2_2_ + auVar82._2_2_ + auVar61._2_2_) >> 2;
          uVar66 = (ushort)(auVar64._4_2_ * 2 + auVar73._4_2_ + auVar82._4_2_ + auVar61._4_2_) >> 2;
          uVar67 = (ushort)(auVar64._6_2_ * 2 + auVar73._6_2_ + auVar82._6_2_ + auVar61._6_2_) >> 2;
          uVar68 = (ushort)(auVar64._8_2_ * 2 + auVar73._8_2_ + auVar82._8_2_ + auVar61._8_2_) >> 2;
          uVar69 = (ushort)(auVar64._10_2_ * 2 + auVar73._10_2_ + auVar82._10_2_ + auVar61._10_2_)
                   >> 2;
          uVar70 = (ushort)(auVar64._12_2_ * 2 + auVar73._12_2_ + auVar82._12_2_ + auVar61._12_2_)
                   >> 2;
          uVar71 = (ushort)(auVar64._14_2_ * 2 + auVar73._14_2_ + auVar82._14_2_ + auVar61._14_2_)
                   >> 2;
          in_XMM4 = pmovzxbw(auVar82,auVar81);
          auVar73 = pmovzxbw(auVar81 >> 8,auVar81 >> 8);
          auVar81 = pmovzxbw(auVar81 >> 0x10,auVar81 >> 0x10);
          uVar72 = (ushort)(auVar73._0_2_ * 2 + auVar81._0_2_ + in_XMM4._0_2_ + auVar61._0_2_) >> 2;
          uVar74 = (ushort)(auVar73._2_2_ * 2 + auVar81._2_2_ + in_XMM4._2_2_ + auVar61._2_2_) >> 2;
          uVar75 = (ushort)(auVar73._4_2_ * 2 + auVar81._4_2_ + in_XMM4._4_2_ + auVar61._4_2_) >> 2;
          uVar76 = (ushort)(auVar73._6_2_ * 2 + auVar81._6_2_ + in_XMM4._6_2_ + auVar61._6_2_) >> 2;
          uVar77 = (ushort)(auVar73._8_2_ * 2 + auVar81._8_2_ + in_XMM4._8_2_ + auVar61._8_2_) >> 2;
          uVar78 = (ushort)(auVar73._10_2_ * 2 + auVar81._10_2_ + in_XMM4._10_2_ + auVar61._10_2_)
                   >> 2;
          uVar79 = (ushort)(auVar73._12_2_ * 2 + auVar81._12_2_ + in_XMM4._12_2_ + auVar61._12_2_)
                   >> 2;
          uVar80 = (ushort)(auVar73._14_2_ * 2 + auVar81._14_2_ + in_XMM4._14_2_ + auVar61._14_2_)
                   >> 2;
          auStack_137[uVar49] = (uVar63 != 0) * (uVar63 < 0x100) * (char)uVar63 - (0xff < uVar63);
          auStack_137[uVar49 + 1] =
               (uVar65 != 0) * (uVar65 < 0x100) * (char)uVar65 - (0xff < uVar65);
          acStack_135[uVar49] = (uVar66 != 0) * (uVar66 < 0x100) * (char)uVar66 - (0xff < uVar66);
          acStack_135[uVar49 + 1] =
               (uVar67 != 0) * (uVar67 < 0x100) * (char)uVar67 - (0xff < uVar67);
          acStack_135[uVar49 + 2] =
               (uVar68 != 0) * (uVar68 < 0x100) * (char)uVar68 - (0xff < uVar68);
          acStack_135[uVar49 + 3] =
               (uVar69 != 0) * (uVar69 < 0x100) * (char)uVar69 - (0xff < uVar69);
          acStack_135[uVar49 + 4] =
               (uVar70 != 0) * (uVar70 < 0x100) * (char)uVar70 - (0xff < uVar70);
          *(char *)((long)&uStack_130 + uVar49) =
               (uVar71 != 0) * (uVar71 < 0x100) * (char)uVar71 - (0xff < uVar71);
          *(char *)((long)&uStack_130 + uVar49 + 1) =
               (uVar72 != 0) * (uVar72 < 0x100) * (char)uVar72 - (0xff < uVar72);
          *(char *)((long)&uStack_130 + uVar49 + 2) =
               (uVar74 != 0) * (uVar74 < 0x100) * (char)uVar74 - (0xff < uVar74);
          *(char *)((long)&uStack_130 + uVar49 + 3) =
               (uVar75 != 0) * (uVar75 < 0x100) * (char)uVar75 - (0xff < uVar75);
          *(char *)((long)&uStack_130 + uVar49 + 4) =
               (uVar76 != 0) * (uVar76 < 0x100) * (char)uVar76 - (0xff < uVar76);
          *(char *)((long)&uStack_130 + uVar49 + 5) =
               (uVar77 != 0) * (uVar77 < 0x100) * (char)uVar77 - (0xff < uVar77);
          *(char *)((long)&uStack_130 + uVar49 + 6) =
               (uVar78 != 0) * (uVar78 < 0x100) * (char)uVar78 - (0xff < uVar78);
          *(char *)((long)&uStack_130 + uVar49 + 7) =
               (uVar79 != 0) * (uVar79 < 0x100) * (char)uVar79 - (0xff < uVar79);
          *(char *)((long)&local_128 + uVar49) =
               (uVar80 != 0) * (uVar80 < 0x100) * (char)uVar80 - (0xff < uVar80);
          uVar49 = uVar49 + 0x10;
        } while (uVar49 < (uVar56 & 0xffffffff));
      }
      *pbVar55 = bVar2;
    }
    else {
      uVar49 = lVar47 * 2;
      bVar3 = pu1_src[lVar47 * 2];
      uVar57 = (uint)bVar3;
      auStack_137[lVar47 * 2 + -1] = bVar3;
      iVar4 = (int)uVar49;
      if (0 < nt) {
        uVar50 = 2;
        if (2 < iVar4) {
          uVar50 = uVar49 & 0xffffffff;
        }
        lVar47 = uVar50 - 2;
        uVar60 = (uint)bVar3;
        iVar54 = uVar57 * 0x10;
        uVar52 = (uint)bVar1;
        uVar53 = (uint)bVar1;
        iVar46 = (uint)bVar3 + (uint)bVar3 * 4;
        iVar58 = (uint)bVar3 + (uint)bVar3 * 2;
        auVar61._8_4_ = (int)lVar47;
        auVar61._0_8_ = lVar47;
        auVar61._12_4_ = (int)((ulong)lVar47 >> 0x20);
        in_XMM1 = pmovsxbq(in_XMM1,0xf0e);
        in_XMM2 = pmovsxbq(in_XMM2,0xd0c);
        in_XMM3 = pmovsxbq(in_XMM3,0xb0a);
        in_XMM4 = pmovsxbq(in_XMM4,0x908);
        in_XMM5 = pmovsxbq(in_XMM5,0x706);
        in_XMM6 = pmovsxbq(in_XMM6,0x504);
        in_XMM7 = pmovsxbq(in_XMM7,0x302);
        in_XMM8 = pmovsxbq(in_XMM8,0x100);
        iVar59 = 0;
        uVar48 = 0;
        do {
          auVar81._8_4_ = (int)uVar48;
          auVar81._0_8_ = uVar48;
          auVar81._12_4_ = (int)(uVar48 >> 0x20);
          auVar64 = auVar61 ^ _DAT_00170240;
          auVar73 = (auVar81 | in_XMM8) ^ _DAT_00170240;
          lVar47 = auVar64._0_8_;
          auVar82._0_8_ = -(ulong)(lVar47 < auVar73._0_8_);
          lVar89 = auVar64._8_8_;
          auVar82._8_8_ = -(ulong)(lVar89 < auVar73._8_8_);
          auVar103 = pshuflw(in_XMM14,auVar82,0xe8);
          auVar73._8_4_ = 0xffffffff;
          auVar73._0_8_ = 0xffffffffffffffff;
          auVar73._12_4_ = 0xffffffff;
          auVar73 = packssdw(auVar103 ^ auVar73,auVar103 ^ auVar73);
          if ((auVar73 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            auStack_137[uVar48] =
                 (char)((iVar4 + -1) * (uint)bVar1 + 0x20 + (uint)bVar3 + iVar59 >> 6);
          }
          auVar82 = packssdw(auVar82,auVar82);
          auVar103._8_4_ = 0xffffffff;
          auVar103._0_8_ = 0xffffffffffffffff;
          auVar103._12_4_ = 0xffffffff;
          auVar82 = packssdw(auVar82 ^ auVar103,auVar82 ^ auVar103);
          auVar82 = packsswb(auVar82,auVar82);
          if ((auVar82 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
            auStack_137[uVar48 + 1] =
                 (char)((iVar4 + -2) * (uint)bVar1 + 0x20 + (uint)bVar3 * 2 + iVar59 >> 6);
          }
          auVar82 = (auVar81 | in_XMM7) ^ _DAT_00170240;
          auVar84._0_8_ = -(ulong)(lVar47 < auVar82._0_8_);
          auVar84._8_8_ = -(ulong)(lVar89 < auVar82._8_8_);
          auVar73 = packssdw(auVar73,auVar84);
          auVar83._8_4_ = 0xffffffff;
          auVar83._0_8_ = 0xffffffffffffffff;
          auVar83._12_4_ = 0xffffffff;
          auVar73 = packssdw(auVar73 ^ auVar83,auVar73 ^ auVar83);
          auVar73 = packsswb(auVar73,auVar73);
          if ((auVar73 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            acStack_135[uVar48] = (char)((iVar4 + -3) * uVar53 + iVar58 + 0x20 + iVar59 >> 6);
          }
          auVar82 = pshufhw(auVar84,auVar84,0x84);
          auVar88._8_4_ = 0xffffffff;
          auVar88._0_8_ = 0xffffffffffffffff;
          auVar88._12_4_ = 0xffffffff;
          auVar82 = packssdw(auVar82 ^ auVar88,auVar82 ^ auVar88);
          auVar82 = packsswb(auVar82,auVar82);
          if ((auVar82 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
            acStack_135[uVar48 + 1] =
                 (char)(iVar59 + (iVar4 + -4) * uVar53 + 0x20 + (uint)bVar3 * 4 >> 6);
          }
          auVar82 = (auVar81 | in_XMM6) ^ _DAT_00170240;
          auVar96._0_8_ = -(ulong)(lVar47 < auVar82._0_8_);
          auVar96._8_8_ = -(ulong)(lVar89 < auVar82._8_8_);
          auVar73 = pshuflw(auVar73,auVar96,0xe8);
          auVar94._8_4_ = 0xffffffff;
          auVar94._0_8_ = 0xffffffffffffffff;
          auVar94._12_4_ = 0xffffffff;
          auVar73 = packssdw(auVar73 ^ auVar94,auVar73 ^ auVar94);
          auVar73 = packsswb(auVar73,auVar73);
          if ((auVar73 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            acStack_135[uVar48 + 2] = (char)((iVar4 + -5) * uVar53 + 0x20 + iVar46 + iVar59 >> 6);
          }
          auVar82 = packssdw(auVar96,auVar96);
          auVar5._8_4_ = 0xffffffff;
          auVar5._0_8_ = 0xffffffffffffffff;
          auVar5._12_4_ = 0xffffffff;
          auVar82 = packssdw(auVar82 ^ auVar5,auVar82 ^ auVar5);
          auVar82 = packsswb(auVar82,auVar82);
          if ((auVar82 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
            acStack_135[uVar48 + 3] =
                 (char)((iVar4 + -6) * uVar53 + 0x20 + iVar58 * 2 + iVar59 >> 6);
          }
          auVar82 = (auVar81 | in_XMM5) ^ _DAT_00170240;
          auVar90._0_8_ = -(ulong)(lVar47 < auVar82._0_8_);
          auVar90._8_8_ = -(ulong)(lVar89 < auVar82._8_8_);
          auVar73 = packssdw(auVar73,auVar90);
          auVar6._8_4_ = 0xffffffff;
          auVar6._0_8_ = 0xffffffffffffffff;
          auVar6._12_4_ = 0xffffffff;
          auVar73 = packssdw(auVar73 ^ auVar6,auVar73 ^ auVar6);
          auVar73 = packsswb(auVar73,auVar73);
          if ((auVar73 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            acStack_135[uVar48 + 4] =
                 (char)(((uint)bVar3 * 8 - uVar60) + (iVar4 + -7) * uVar53 + 0x20 + iVar59 >> 6);
          }
          auVar82 = pshufhw(auVar90,auVar90,0x84);
          auVar7._8_4_ = 0xffffffff;
          auVar7._0_8_ = 0xffffffffffffffff;
          auVar7._12_4_ = 0xffffffff;
          auVar82 = packssdw(auVar82 ^ auVar7,auVar82 ^ auVar7);
          auVar82 = packsswb(auVar82,auVar82);
          if ((auVar82 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
            *(char *)((long)&uStack_130 + uVar48) =
                 (char)((iVar4 + -8) * uVar53 + (uint)bVar3 * 8 + 0x20 + iVar59 >> 6);
          }
          auVar82 = (auVar81 | in_XMM4) ^ _DAT_00170240;
          auVar91._0_8_ = -(ulong)(lVar47 < auVar82._0_8_);
          auVar91._8_8_ = -(ulong)(lVar89 < auVar82._8_8_);
          auVar73 = pshuflw(auVar73,auVar91,0xe8);
          auVar8._8_4_ = 0xffffffff;
          auVar8._0_8_ = 0xffffffffffffffff;
          auVar8._12_4_ = 0xffffffff;
          auVar73 = packssdw(auVar73 ^ auVar8,auVar73 ^ auVar8);
          auVar73 = packsswb(auVar73,auVar73);
          if ((auVar73 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(char *)((long)&uStack_130 + uVar48 + 1) =
                 (char)((uint)bVar3 + (uint)bVar3 * 8 + (iVar4 + -9) * uVar53 + 0x20 + iVar59 >> 6);
          }
          auVar82 = packssdw(auVar91,auVar91);
          auVar9._8_4_ = 0xffffffff;
          auVar9._0_8_ = 0xffffffffffffffff;
          auVar9._12_4_ = 0xffffffff;
          auVar82 = packssdw(auVar82 ^ auVar9,auVar82 ^ auVar9);
          auVar82 = packsswb(auVar82,auVar82);
          if ((auVar82 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
            *(char *)((long)&uStack_130 + uVar48 + 2) =
                 (char)((iVar4 + -10) * uVar53 + 0x20 + iVar46 * 2 + iVar59 >> 6);
          }
          auVar82 = (auVar81 | in_XMM3) ^ _DAT_00170240;
          auVar92._0_8_ = -(ulong)(lVar47 < auVar82._0_8_);
          auVar92._8_8_ = -(ulong)(lVar89 < auVar82._8_8_);
          auVar73 = packssdw(auVar73,auVar92);
          auVar10._8_4_ = 0xffffffff;
          auVar10._0_8_ = 0xffffffffffffffff;
          auVar10._12_4_ = 0xffffffff;
          auVar73 = packssdw(auVar73 ^ auVar10,auVar73 ^ auVar10);
          auVar73 = packsswb(auVar73,auVar73);
          if ((auVar73 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(char *)((long)&uStack_130 + uVar48 + 3) =
                 (char)((iVar4 + -0xb) * uVar52 + 0x20 + (uint)bVar3 + iVar46 * 2 + iVar59 >> 6);
          }
          auVar82 = pshufhw(auVar92,auVar92,0x84);
          auVar11._8_4_ = 0xffffffff;
          auVar11._0_8_ = 0xffffffffffffffff;
          auVar11._12_4_ = 0xffffffff;
          auVar82 = packssdw(auVar82 ^ auVar11,auVar82 ^ auVar11);
          auVar82 = packsswb(auVar82,auVar82);
          if ((auVar82 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
            *(char *)((long)&uStack_130 + uVar48 + 4) =
                 (char)((iVar4 + -0xc) * uVar52 + 0x20 + iVar58 * 4 + iVar59 >> 6);
          }
          auVar82 = (auVar81 | in_XMM2) ^ _DAT_00170240;
          auVar93._0_8_ = -(ulong)(lVar47 < auVar82._0_8_);
          auVar93._8_8_ = -(ulong)(lVar89 < auVar82._8_8_);
          auVar73 = pshuflw(auVar73,auVar93,0xe8);
          auVar12._8_4_ = 0xffffffff;
          auVar12._0_8_ = 0xffffffffffffffff;
          auVar12._12_4_ = 0xffffffff;
          auVar73 = packssdw(auVar73 ^ auVar12,auVar73 ^ auVar12);
          in_XMM14 = packsswb(auVar73,auVar73);
          if ((in_XMM14 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(char *)((long)&uStack_130 + uVar48 + 5) =
                 (char)((iVar4 + -0xd) * uVar52 + 0x20 + (uint)bVar3 + iVar58 * 4 + iVar59 >> 6);
          }
          auVar73 = packssdw(auVar93,auVar93);
          auVar13._8_4_ = 0xffffffff;
          auVar13._0_8_ = 0xffffffffffffffff;
          auVar13._12_4_ = 0xffffffff;
          auVar73 = packssdw(auVar73 ^ auVar13,auVar73 ^ auVar13);
          auVar73 = packsswb(auVar73,auVar73);
          if ((auVar73 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
            *(char *)((long)&uStack_130 + uVar48 + 6) =
                 (char)(((iVar54 - uVar60) - uVar60) + (iVar4 + -0xe) * uVar52 + 0x20 + iVar59 >> 6)
            ;
          }
          auVar73 = (auVar81 | in_XMM1) ^ _DAT_00170240;
          auVar85._0_8_ = -(ulong)(lVar47 < auVar73._0_8_);
          auVar85._8_8_ = -(ulong)(lVar89 < auVar73._8_8_);
          auVar73 = packssdw(auVar64,auVar85);
          auVar64._8_4_ = 0xffffffff;
          auVar64._0_8_ = 0xffffffffffffffff;
          auVar64._12_4_ = 0xffffffff;
          auVar73 = packssdw(auVar73 ^ auVar64,auVar73 ^ auVar64);
          auVar73 = packsswb(auVar73,auVar73);
          if ((auVar73 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(char *)((long)&uStack_130 + uVar48 + 7) =
                 (char)(iVar46 * 3 + (iVar4 + -0xf) * (uint)bVar1 + 0x20 + iVar59 >> 6);
          }
          auVar73 = pshufhw(auVar85,auVar85,0x84);
          auVar14._8_4_ = 0xffffffff;
          auVar14._0_8_ = 0xffffffffffffffff;
          auVar14._12_4_ = 0xffffffff;
          auVar73 = packssdw(auVar73 ^ auVar14,auVar73 ^ auVar14);
          auVar73 = packsswb(auVar73,auVar73);
          if ((auVar73 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
            *(char *)((long)&local_128 + uVar48) =
                 (char)((iVar4 + -0x10) * (uint)bVar1 + iVar54 + 0x20 + iVar59 >> 6);
          }
          uVar48 = uVar48 + 0x10;
          iVar59 = iVar59 + iVar54 + (uint)bVar1 * -0x10;
        } while (((int)uVar50 + 0xeU & 0xfffffff0) != uVar48);
      }
      if (0 < nt) {
        uVar52 = (uint)bVar2;
        uVar50 = uVar49 & 0xffffffff;
        uVar48 = 2;
        if (2 < iVar4) {
          uVar48 = uVar49 & 0xffffffff;
        }
        lVar47 = uVar48 - 2;
        iVar54 = (uint)bVar2 + (uint)bVar2 * 4;
        iVar59 = (uint)bVar2 + (uint)bVar2 * 2;
        iVar46 = (uint)bVar2 * 0x10;
        uVar53 = (uint)bVar3;
        auVar62._8_4_ = (int)lVar47;
        auVar62._0_8_ = lVar47;
        auVar62._12_4_ = (int)((ulong)lVar47 >> 0x20);
        auVar61 = pmovsxbq(in_XMM1,0xf0e);
        auVar73 = pmovsxbq(in_XMM2,0xd0c);
        auVar81 = pmovsxbq(in_XMM3,0xb0a);
        auVar64 = pmovsxbq(in_XMM4,0x908);
        auVar82 = pmovsxbq(in_XMM5,0x706);
        auVar103 = pmovsxbq(in_XMM6,0x504);
        auVar83 = pmovsxbq(in_XMM7,0x302);
        auVar84 = pmovsxbq(in_XMM8,0x100);
        iVar58 = 0;
        uVar49 = 0;
        do {
          auVar86._8_4_ = (int)uVar49;
          auVar86._0_8_ = uVar49;
          auVar86._12_4_ = (int)(uVar49 >> 0x20);
          auVar88 = auVar62 ^ _DAT_00170240;
          auVar94 = (auVar86 | auVar84) ^ _DAT_00170240;
          lVar47 = auVar88._0_8_;
          auVar95._0_8_ = -(ulong)(lVar47 < auVar94._0_8_);
          lVar89 = auVar88._8_8_;
          auVar95._8_8_ = -(ulong)(lVar89 < auVar94._8_8_);
          auVar94 = pshuflw(in_XMM14,auVar95,0xe8);
          auVar15._8_4_ = 0xffffffff;
          auVar15._0_8_ = 0xffffffffffffffff;
          auVar15._12_4_ = 0xffffffff;
          auVar94 = packssdw(auVar94 ^ auVar15,auVar94 ^ auVar15);
          if ((auVar94 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            auStack_137[uVar49 + uVar50] =
                 (char)((iVar4 + -1) * uVar57 + uVar52 + 0x20 + iVar58 >> 6);
          }
          auVar96 = packssdw(auVar95,auVar95);
          auVar16._8_4_ = 0xffffffff;
          auVar16._0_8_ = 0xffffffffffffffff;
          auVar16._12_4_ = 0xffffffff;
          auVar96 = packssdw(auVar96 ^ auVar16,auVar96 ^ auVar16);
          auVar96 = packsswb(auVar96,auVar96);
          if ((auVar96 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
            auStack_137[uVar49 + uVar50 + 1] =
                 (char)((iVar4 + -2) * uVar57 + uVar52 * 2 + 0x20 + iVar58 >> 6);
          }
          auVar96 = (auVar86 | auVar83) ^ _DAT_00170240;
          auVar97._0_8_ = -(ulong)(lVar47 < auVar96._0_8_);
          auVar97._8_8_ = -(ulong)(lVar89 < auVar96._8_8_);
          auVar94 = packssdw(auVar94,auVar97);
          auVar17._8_4_ = 0xffffffff;
          auVar17._0_8_ = 0xffffffffffffffff;
          auVar17._12_4_ = 0xffffffff;
          auVar94 = packssdw(auVar94 ^ auVar17,auVar94 ^ auVar17);
          auVar94 = packsswb(auVar94,auVar94);
          if ((auVar94 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            acStack_135[uVar49 + uVar50] =
                 (char)((iVar4 + -3) * uVar57 + 0x20 + iVar59 + iVar58 >> 6);
          }
          auVar96 = pshufhw(auVar97,auVar97,0x84);
          auVar18._8_4_ = 0xffffffff;
          auVar18._0_8_ = 0xffffffffffffffff;
          auVar18._12_4_ = 0xffffffff;
          auVar96 = packssdw(auVar96 ^ auVar18,auVar96 ^ auVar18);
          auVar96 = packsswb(auVar96,auVar96);
          if ((auVar96 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
            acStack_135[uVar49 + uVar50 + 1] =
                 (char)((iVar4 + -4) * uVar53 + uVar52 * 4 + 0x20 + iVar58 >> 6);
          }
          auVar96 = (auVar86 | auVar103) ^ _DAT_00170240;
          auVar98._0_8_ = -(ulong)(lVar47 < auVar96._0_8_);
          auVar98._8_8_ = -(ulong)(lVar89 < auVar96._8_8_);
          auVar94 = pshuflw(auVar94,auVar98,0xe8);
          auVar19._8_4_ = 0xffffffff;
          auVar19._0_8_ = 0xffffffffffffffff;
          auVar19._12_4_ = 0xffffffff;
          auVar94 = packssdw(auVar94 ^ auVar19,auVar94 ^ auVar19);
          auVar94 = packsswb(auVar94,auVar94);
          if ((auVar94 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            acStack_135[uVar49 + uVar50 + 2] =
                 (char)((iVar4 + -5) * uVar57 + iVar54 + 0x20 + iVar58 >> 6);
          }
          auVar96 = packssdw(auVar98,auVar98);
          auVar20._8_4_ = 0xffffffff;
          auVar20._0_8_ = 0xffffffffffffffff;
          auVar20._12_4_ = 0xffffffff;
          auVar96 = packssdw(auVar96 ^ auVar20,auVar96 ^ auVar20);
          auVar96 = packsswb(auVar96,auVar96);
          if ((auVar96 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
            acStack_135[uVar49 + uVar50 + 3] =
                 (char)((iVar4 + -6) * uVar57 + 0x20 + iVar59 * 2 + iVar58 >> 6);
          }
          auVar96 = (auVar86 | auVar82) ^ _DAT_00170240;
          auVar99._0_8_ = -(ulong)(lVar47 < auVar96._0_8_);
          auVar99._8_8_ = -(ulong)(lVar89 < auVar96._8_8_);
          auVar94 = packssdw(auVar94,auVar99);
          auVar21._8_4_ = 0xffffffff;
          auVar21._0_8_ = 0xffffffffffffffff;
          auVar21._12_4_ = 0xffffffff;
          auVar94 = packssdw(auVar94 ^ auVar21,auVar94 ^ auVar21);
          auVar94 = packsswb(auVar94,auVar94);
          if ((auVar94 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            acStack_135[uVar49 + uVar50 + 4] =
                 (char)((iVar4 + -7) * uVar57 + ((uint)bVar2 * 8 - (uint)bVar2) + 0x20 + iVar58 >> 6
                       );
          }
          auVar96 = pshufhw(auVar99,auVar99,0x84);
          auVar22._8_4_ = 0xffffffff;
          auVar22._0_8_ = 0xffffffffffffffff;
          auVar22._12_4_ = 0xffffffff;
          auVar96 = packssdw(auVar96 ^ auVar22,auVar96 ^ auVar22);
          auVar96 = packsswb(auVar96,auVar96);
          if ((auVar96 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
            *(char *)((long)&uStack_130 + uVar49 + uVar50) =
                 (char)((iVar4 + -8) * uVar53 + uVar52 * 8 + 0x20 + iVar58 >> 6);
          }
          auVar96 = (auVar86 | auVar64) ^ _DAT_00170240;
          auVar100._0_8_ = -(ulong)(lVar47 < auVar96._0_8_);
          auVar100._8_8_ = -(ulong)(lVar89 < auVar96._8_8_);
          auVar94 = pshuflw(auVar94,auVar100,0xe8);
          auVar23._8_4_ = 0xffffffff;
          auVar23._0_8_ = 0xffffffffffffffff;
          auVar23._12_4_ = 0xffffffff;
          auVar94 = packssdw(auVar94 ^ auVar23,auVar94 ^ auVar23);
          auVar94 = packsswb(auVar94,auVar94);
          if ((auVar94 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            *(char *)((long)&uStack_130 + uVar49 + uVar50 + 1) =
                 (char)(uVar52 * 9 + (iVar4 + -9) * uVar57 + 0x20 + iVar58 >> 6);
          }
          auVar96 = packssdw(auVar100,auVar100);
          auVar24._8_4_ = 0xffffffff;
          auVar24._0_8_ = 0xffffffffffffffff;
          auVar24._12_4_ = 0xffffffff;
          auVar96 = packssdw(auVar96 ^ auVar24,auVar96 ^ auVar24);
          auVar96 = packsswb(auVar96,auVar96);
          if ((auVar96 & (undefined1  [16])0x100) != (undefined1  [16])0x0) {
            *(char *)((long)&uStack_130 + uVar49 + uVar50 + 2) =
                 (char)((iVar4 + -10) * uVar57 + iVar54 * 2 + 0x20 + iVar58 >> 6);
          }
          auVar96 = (auVar86 | auVar81) ^ _DAT_00170240;
          auVar101._0_8_ = -(ulong)(lVar47 < auVar96._0_8_);
          auVar101._8_8_ = -(ulong)(lVar89 < auVar96._8_8_);
          auVar94 = packssdw(auVar94,auVar101);
          auVar25._8_4_ = 0xffffffff;
          auVar25._0_8_ = 0xffffffffffffffff;
          auVar25._12_4_ = 0xffffffff;
          auVar94 = packssdw(auVar94 ^ auVar25,auVar94 ^ auVar25);
          auVar94 = packsswb(auVar94,auVar94);
          if ((auVar94 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
            *(char *)((long)&uStack_130 + uVar49 + uVar50 + 3) =
                 (char)((iVar4 + -0xb) * uVar53 + (uint)bVar2 + iVar54 * 2 + 0x20 + iVar58 >> 6);
          }
          auVar96 = pshufhw(auVar101,auVar101,0x84);
          auVar26._8_4_ = 0xffffffff;
          auVar26._0_8_ = 0xffffffffffffffff;
          auVar26._12_4_ = 0xffffffff;
          auVar96 = packssdw(auVar96 ^ auVar26,auVar96 ^ auVar26);
          auVar96 = packsswb(auVar96,auVar96);
          if ((auVar96 & (undefined1  [16])0x1000000) != (undefined1  [16])0x0) {
            *(char *)((long)&uStack_130 + uVar49 + uVar50 + 4) =
                 (char)((iVar4 + -0xc) * uVar57 + iVar59 * 4 + 0x20 + iVar58 >> 6);
          }
          auVar96 = (auVar86 | auVar73) ^ _DAT_00170240;
          auVar102._0_8_ = -(ulong)(lVar47 < auVar96._0_8_);
          auVar102._8_8_ = -(ulong)(lVar89 < auVar96._8_8_);
          auVar94 = pshuflw(auVar94,auVar102,0xe8);
          auVar27._8_4_ = 0xffffffff;
          auVar27._0_8_ = 0xffffffffffffffff;
          auVar27._12_4_ = 0xffffffff;
          auVar94 = packssdw(auVar94 ^ auVar27,auVar94 ^ auVar27);
          in_XMM14 = packsswb(auVar94,auVar94);
          if ((in_XMM14 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
            *(char *)((long)&uStack_130 + uVar49 + uVar50 + 5) =
                 (char)((iVar4 + -0xd) * uVar53 + (uint)bVar2 + iVar59 * 4 + 0x20 + iVar58 >> 6);
          }
          auVar94 = packssdw(auVar102,auVar102);
          auVar28._8_4_ = 0xffffffff;
          auVar28._0_8_ = 0xffffffffffffffff;
          auVar28._12_4_ = 0xffffffff;
          auVar94 = packssdw(auVar94 ^ auVar28,auVar94 ^ auVar28);
          auVar94 = packsswb(auVar94,auVar94);
          if ((auVar94 & (undefined1  [16])0x10000000000) != (undefined1  [16])0x0) {
            *(char *)((long)&uStack_130 + uVar49 + uVar50 + 6) =
                 (char)((iVar4 + -0xe) * uVar53 + (iVar46 - ((uint)bVar2 + (uint)bVar2)) + 0x20 +
                        iVar58 >> 6);
          }
          auVar94 = (auVar86 | auVar61) ^ _DAT_00170240;
          auVar87._0_8_ = -(ulong)(lVar47 < auVar94._0_8_);
          auVar87._8_8_ = -(ulong)(lVar89 < auVar94._8_8_);
          auVar88 = packssdw(auVar88,auVar87);
          auVar29._8_4_ = 0xffffffff;
          auVar29._0_8_ = 0xffffffffffffffff;
          auVar29._12_4_ = 0xffffffff;
          auVar88 = packssdw(auVar88 ^ auVar29,auVar88 ^ auVar29);
          auVar88 = packsswb(auVar88,auVar88);
          if ((auVar88 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
            *(char *)((long)&uStack_130 + uVar49 + uVar50 + 7) =
                 (char)((iVar4 + -0xf) * uVar53 + iVar54 * 3 + 0x20 + iVar58 >> 6);
          }
          auVar88 = pshufhw(auVar87,auVar87,0x84);
          auVar30._8_4_ = 0xffffffff;
          auVar30._0_8_ = 0xffffffffffffffff;
          auVar30._12_4_ = 0xffffffff;
          auVar88 = packssdw(auVar88 ^ auVar30,auVar88 ^ auVar30);
          auVar88 = packsswb(auVar88,auVar88);
          if ((auVar88 & (undefined1  [16])0x100000000000000) != (undefined1  [16])0x0) {
            *(char *)((long)&local_128 + uVar49 + uVar50) =
                 (char)((iVar4 + -0x10) * uVar53 + iVar46 + 0x20 + iVar58 >> 6);
          }
          uVar49 = uVar49 + 0x10;
          iVar58 = iVar58 + iVar46 + uVar57 * -0x10;
        } while (((int)uVar48 + 0xeU & 0xfffffff0) != uVar49);
      }
    }
    if (nt == 0x10) {
      *(ulong *)pu1_dst = CONCAT71(_auStack_137,local_138);
      *(undefined8 *)(pu1_dst + 8) = uStack_130;
      *(undefined8 *)(pu1_dst + 0x10) = local_128;
      *(undefined8 *)(pu1_dst + 0x18) = uStack_120;
      *(undefined8 *)(pu1_dst + 0x20) = local_118;
      *(undefined8 *)(pu1_dst + 0x28) = uStack_110;
      *(undefined8 *)(pu1_dst + 0x30) = local_108;
      *(undefined8 *)(pu1_dst + 0x38) = uStack_100;
    }
    else if (nt == 8) {
      *(ulong *)pu1_dst = CONCAT71(_auStack_137,local_138);
      *(undefined8 *)(pu1_dst + 8) = uStack_130;
      *(undefined8 *)(pu1_dst + 0x10) = local_128;
      *(undefined8 *)(pu1_dst + 0x18) = uStack_120;
    }
    else if (nt == 4) {
      *(ulong *)pu1_dst = CONCAT71(_auStack_137,local_138);
      *(undefined8 *)(pu1_dst + 8) = uStack_130;
    }
    else {
      if (nt != 0x20) {
        return;
      }
      *(ulong *)pu1_dst = CONCAT71(_auStack_137,local_138);
      *(undefined8 *)(pu1_dst + 8) = uStack_130;
      *(undefined8 *)(pu1_dst + 0x10) = local_128;
      *(undefined8 *)(pu1_dst + 0x18) = uStack_120;
      *(undefined8 *)(pu1_dst + 0x20) = local_118;
      *(undefined8 *)(pu1_dst + 0x28) = uStack_110;
      *(undefined8 *)(pu1_dst + 0x30) = local_108;
      *(undefined8 *)(pu1_dst + 0x38) = uStack_100;
      *(undefined8 *)(pu1_dst + 0x40) = local_f8;
      *(undefined8 *)(pu1_dst + 0x48) = uStack_f0;
      *(undefined8 *)(pu1_dst + 0x50) = local_e8;
      *(undefined8 *)(pu1_dst + 0x58) = uStack_e0;
      *(undefined8 *)(pu1_dst + 0x60) = local_d8;
      *(undefined8 *)(pu1_dst + 0x68) = uStack_d0;
      *(undefined8 *)(pu1_dst + 0x70) = local_c8;
      *(undefined8 *)(pu1_dst + 0x78) = uStack_c0;
    }
  }
  pu1_dst[uVar56] = *pbVar55;
switchD_0014e8c3_caseD_2:
  return;
}

Assistant:

void ihevc_intra_pred_ref_filtering_sse42(UWORD8 *pu1_src,
                                          WORD32 nt,
                                          UWORD8 *pu1_dst,
                                          WORD32 mode,
                                          WORD32 strong_intra_smoothing_enable_flag)
{
    WORD32 filter_flag;
    WORD32 i; /* Generic indexing variable */
    WORD32 four_nt = 4 * nt;
    UWORD8 au1_flt[(4 * MAX_CU_SIZE) + 1];
    WORD32 bi_linear_int_flag = 0;
    WORD32 abs_cond_left_flag = 0;
    WORD32 abs_cond_top_flag = 0;
    WORD32 dc_val = 1 << (BIT_DEPTH - 5);
    __m128i src_temp1, src_temp2, src_temp3, src_temp7;
    __m128i src_temp4, src_temp5, src_temp6, src_temp8;

    //WORD32 strong_intra_smoothing_enable_flag  = 1;



    filter_flag = gau1_intra_pred_ref_filter[mode] & (1 << (CTZ(nt) - 2));
    if(0 == filter_flag)
    {
        if(pu1_src == pu1_dst)
        {
            return;
        }
        else
        {
            if(nt == 4)
            {
                src_temp1 = _mm_loadu_si128((__m128i *)(pu1_src));
                _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
                pu1_dst[four_nt] = pu1_src[four_nt];

            }

            else if(nt == 8)
            {

                src_temp1 = _mm_loadu_si128((__m128i *)(pu1_src));
                src_temp2 = _mm_loadu_si128((__m128i *)(pu1_src + 16));

                _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp2);


                pu1_dst[four_nt] = pu1_src[four_nt];
            }
            else if(nt == 16)
            {

                src_temp1 = _mm_loadu_si128((__m128i *)(pu1_src));
                src_temp2 = _mm_loadu_si128((__m128i *)(pu1_src + 16));
                src_temp3 = _mm_loadu_si128((__m128i *)(pu1_src + 32));
                src_temp4 = _mm_loadu_si128((__m128i *)(pu1_src + 48));

                _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + 32), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + 48), src_temp4);

                pu1_dst[four_nt] = pu1_src[four_nt];
            }
            else if(nt == 32)
            {

                src_temp1 = _mm_loadu_si128((__m128i *)(pu1_src));
                src_temp2 = _mm_loadu_si128((__m128i *)(pu1_src + 16));
                src_temp3 = _mm_loadu_si128((__m128i *)(pu1_src + 32));
                src_temp4 = _mm_loadu_si128((__m128i *)(pu1_src + 48));

                src_temp5 = _mm_loadu_si128((__m128i *)(pu1_src + 64));
                src_temp6 = _mm_loadu_si128((__m128i *)(pu1_src + 80));
                src_temp7 = _mm_loadu_si128((__m128i *)(pu1_src + 96));
                src_temp8 = _mm_loadu_si128((__m128i *)(pu1_src + 112));

                _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
                _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp2);
                _mm_storeu_si128((__m128i *)(pu1_dst + 32), src_temp3);
                _mm_storeu_si128((__m128i *)(pu1_dst + 48), src_temp4);

                _mm_storeu_si128((__m128i *)(pu1_dst + 64), src_temp5);
                _mm_storeu_si128((__m128i *)(pu1_dst + 80), src_temp6);
                _mm_storeu_si128((__m128i *)(pu1_dst + 96), src_temp7);
                _mm_storeu_si128((__m128i *)(pu1_dst + 112), src_temp8);

                pu1_dst[four_nt] = pu1_src[four_nt];
            }

        }
    }

    else
    {
        /* If strong intra smoothin is enabled and transform size is 32 */
        if((1 == strong_intra_smoothing_enable_flag) && (32 == nt))
        {
            /* Strong Intra Filtering */
            abs_cond_top_flag = (abs(pu1_src[2 * nt] + pu1_src[4 * nt]
                                     - (2 * pu1_src[3 * nt]))) < dc_val;
            abs_cond_left_flag = (abs(pu1_src[2 * nt] + pu1_src[0]
                                      - (2 * pu1_src[nt]))) < dc_val;

            bi_linear_int_flag = ((1 == abs_cond_left_flag)
                            && (1 == abs_cond_top_flag));
        }
        /* Extremities Untouched*/
        au1_flt[0] = pu1_src[0];
        au1_flt[4 * nt] = pu1_src[4 * nt];

        /* Strong filtering of reference samples */
        if(1 == bi_linear_int_flag)
        {
            au1_flt[2 * nt] = pu1_src[2 * nt];

            for(i = 1; i < (2 * nt); i++)
                au1_flt[i] = (((2 * nt) - i) * pu1_src[0] + i * pu1_src[2 * nt] + 32) >> 6;

            for(i = 1; i < (2 * nt); i++)
                au1_flt[i + (2 * nt)] = (((2 * nt) - i) * pu1_src[2 * nt] + i * pu1_src[4 * nt] + 32) >> 6;
        }
        else
        {
            __m128i const_value_8x16;

            const_value_8x16 = _mm_set1_epi16(2);

            au1_flt[0] = pu1_src[0];
            au1_flt[4 * nt] = pu1_src[4 * nt];

            /* Perform bilinear filtering of Reference Samples */
            for(i = 0; i < (four_nt); i += 16)
            {
                src_temp1 = _mm_loadu_si128((__m128i *)(pu1_src + i));
                src_temp2 = _mm_srli_si128(src_temp1, 1);
                src_temp3 = _mm_srli_si128(src_temp2, 1);

                src_temp1 =  _mm_cvtepu8_epi16(src_temp1);
                src_temp2 =  _mm_cvtepu8_epi16(src_temp2);
                src_temp3 =  _mm_cvtepu8_epi16(src_temp3);

                src_temp2 = _mm_slli_epi16(src_temp2,  1);

                src_temp1 = _mm_add_epi16(src_temp1, src_temp2);
                src_temp1 = _mm_add_epi16(src_temp1, src_temp3);
                src_temp1 = _mm_add_epi16(src_temp1, const_value_8x16);

                src_temp1 = _mm_srai_epi16(src_temp1,  2);

                src_temp4 = _mm_loadu_si128((__m128i *)(pu1_src + 8 + i));
                src_temp5 = _mm_srli_si128(src_temp4, 1);
                src_temp6 = _mm_srli_si128(src_temp5, 1);

                src_temp4 =  _mm_cvtepu8_epi16(src_temp4);
                src_temp5 =  _mm_cvtepu8_epi16(src_temp5);
                src_temp6 =  _mm_cvtepu8_epi16(src_temp6);

                src_temp5 = _mm_slli_epi16(src_temp5,  1);

                src_temp4 = _mm_add_epi16(src_temp4, src_temp5);
                src_temp4 = _mm_add_epi16(src_temp4, src_temp6);
                src_temp4 = _mm_add_epi16(src_temp4, const_value_8x16);

                src_temp4 = _mm_srai_epi16(src_temp4,  2);

                /* converting 16 bit to 8 bit */
                src_temp1 = _mm_packus_epi16(src_temp1, src_temp4);

                _mm_storeu_si128((__m128i *)(au1_flt + 1 + i), src_temp1);
            }
            au1_flt[4 * nt] = pu1_src[4 * nt];
        }

        if(nt == 4)
        {
            src_temp1 = _mm_loadu_si128((__m128i *)(au1_flt));
            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
            pu1_dst[four_nt] = au1_flt[four_nt];
        }
        else if(nt == 8)
        {

            src_temp1 = _mm_loadu_si128((__m128i *)(au1_flt));
            src_temp2 = _mm_loadu_si128((__m128i *)(au1_flt + 16));

            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp2);

            pu1_dst[four_nt] = au1_flt[four_nt];
        }
        else if(nt == 16)
        {

            src_temp1 = _mm_loadu_si128((__m128i *)(au1_flt));
            src_temp2 = _mm_loadu_si128((__m128i *)(au1_flt + 16));
            src_temp3 = _mm_loadu_si128((__m128i *)(au1_flt + 32));
            src_temp4 = _mm_loadu_si128((__m128i *)(au1_flt + 48));

            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 32), src_temp3);
            _mm_storeu_si128((__m128i *)(pu1_dst + 48), src_temp4);

            pu1_dst[four_nt] = au1_flt[four_nt];
        }

        else if(nt == 32)
        {

            src_temp1 = _mm_loadu_si128((__m128i *)(au1_flt));
            src_temp2 = _mm_loadu_si128((__m128i *)(au1_flt + 16));
            src_temp3 = _mm_loadu_si128((__m128i *)(au1_flt + 32));
            src_temp4 = _mm_loadu_si128((__m128i *)(au1_flt + 48));

            src_temp5 = _mm_loadu_si128((__m128i *)(au1_flt + 64));
            src_temp6 = _mm_loadu_si128((__m128i *)(au1_flt + 80));
            src_temp7 = _mm_loadu_si128((__m128i *)(au1_flt + 96));
            src_temp8 = _mm_loadu_si128((__m128i *)(au1_flt + 112));

            _mm_storeu_si128((__m128i *)(pu1_dst), src_temp1);
            _mm_storeu_si128((__m128i *)(pu1_dst + 16), src_temp2);
            _mm_storeu_si128((__m128i *)(pu1_dst + 32), src_temp3);
            _mm_storeu_si128((__m128i *)(pu1_dst + 48), src_temp4);

            _mm_storeu_si128((__m128i *)(pu1_dst + 64), src_temp5);
            _mm_storeu_si128((__m128i *)(pu1_dst + 80), src_temp6);
            _mm_storeu_si128((__m128i *)(pu1_dst + 96), src_temp7);
            _mm_storeu_si128((__m128i *)(pu1_dst + 112), src_temp8);

            pu1_dst[four_nt] = au1_flt[four_nt];
        }

    }
}